

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

bool __thiscall
Market::match(Market *this,queue<Order,_std::deque<Order,_std::allocator<Order>_>_> *orders)

{
  iterator __position;
  iterator __position_00;
  size_type sVar1;
  Market *this_00;
  Order *bid;
  Order *ask;
  
  this_00 = this;
  while (((this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 &&
         ((this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))) {
    __position._M_node = (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __position_00._M_node = (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    if ((double)__position._M_node[5]._M_left < (double)__position_00._M_node[5]._M_left) break;
    match(this_00,(Order *)&__position._M_node[1]._M_parent,
          (Order *)&__position_00._M_node[1]._M_parent);
    std::deque<Order,_std::allocator<Order>_>::push_back
              (&orders->c,(value_type *)&__position._M_node[1]._M_parent);
    this_00 = (Market *)orders;
    std::deque<Order,_std::allocator<Order>_>::push_back
              (&orders->c,(value_type *)&__position_00._M_node[1]._M_parent);
    if (*(long *)(__position._M_node + 6) == 0) {
      this_00 = (Market *)&this->m_bidOrders;
      std::
      _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::greater<double>,std::allocator<std::pair<double_const,Order>>>
                          *)&this->m_bidOrders,__position);
    }
    if (*(long *)(__position_00._M_node + 6) == 0) {
      this_00 = (Market *)&this->m_askOrders;
      std::
      _Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
      ::erase_abi_cxx11_((_Rb_tree<double,std::pair<double_const,Order>,std::_Select1st<std::pair<double_const,Order>>,std::less<double>,std::allocator<std::pair<double_const,Order>>>
                          *)&this->m_askOrders,__position_00);
    }
  }
  sVar1 = std::deque<Order,_std::allocator<Order>_>::size(&orders->c);
  return sVar1 != 0;
}

Assistant:

bool Market::match( std::queue < Order > & orders )
{
  while ( true )
  {
    if ( !m_bidOrders.size() || !m_askOrders.size() )
      return orders.size() != 0;

    BidOrders::iterator iBid = m_bidOrders.begin();
    AskOrders::iterator iAsk = m_askOrders.begin();

    if ( iBid->second.getPrice() >= iAsk->second.getPrice() )
    {
      Order & bid = iBid->second;
      Order& ask = iAsk->second;

      match( bid, ask );
      orders.push( bid );
      orders.push( ask );

      if ( bid.isClosed() ) m_bidOrders.erase( iBid );
      if ( ask.isClosed() ) m_askOrders.erase( iAsk );
    }
    else
      return orders.size() != 0;
  }
}